

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall
llm_tokenizer_spm_session::try_add_bigram(llm_tokenizer_spm_session *this,int left,int right)

{
  pointer plVar1;
  _Head_base<0UL,_llama_vocab::impl_*,_false> _Var2;
  uint id;
  token_data *ptVar3;
  mapped_type *pmVar4;
  string text;
  llm_bigram_spm bigram;
  string local_60;
  value_type local_40;
  
  if (right != -1 && left != -1) {
    plVar1 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,plVar1[left].text,
               plVar1[left].text + plVar1[right].n + plVar1[left].n);
    id = llama_vocab::text_to_token(this->vocab,&local_60);
    if ((id != 0xffffffff) &&
       (_Var2._M_head_impl =
             (this->vocab->pimpl)._M_t.
             super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
             super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
             super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl,
       id < (uint)((int)((ulong)((long)*(pointer *)((long)&(_Var2._M_head_impl)->id_to_token + 8) -
                                *(long *)&((_Var2._M_head_impl)->id_to_token).
                                          super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                                ) >> 3) * -0x33333333))) {
      ptVar3 = llama_vocab::get_token_data(this->vocab,id);
      local_40.score = ptVar3->score;
      local_40.size = local_60._M_string_length;
      local_40.left = left;
      local_40.right = right;
      llama_vocab::std::
      priority_queue<llm_bigram_spm,_std::vector<llm_bigram_spm,_std::allocator<llm_bigram_spm>_>,_llm_bigram_spm::comparator>
      ::push(&this->work_queue,&local_40);
      pmVar4 = llama_vocab::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
               ::operator[](&this->rev_merge,&local_60);
      pmVar4->first = left;
      pmVar4->second = right;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void try_add_bigram(int left, int right) {
        if (left == -1 || right == -1) {
            return;
        }
        const std::string text = std::string(symbols[left].text, symbols[left].n + symbols[right].n);
        auto token = vocab.text_to_token(text);

        if (token == LLAMA_TOKEN_NULL) {
            return;
        }

        if (static_cast<uint32_t>(token) >= vocab.n_tokens()) {
            return;
        }

        const auto & tok_data = vocab.get_token_data(token);

        llm_bigram_spm bigram;
        bigram.left  = left;
        bigram.right = right;
        bigram.score = tok_data.score;
        bigram.size  = text.size();

        work_queue.push(bigram);

        // Do we need to support is_unused?
        rev_merge[text] = std::make_pair(left, right);
    }